

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O0

void Kit_TruthSemiCanonicize_Yasha_simple(word *pInOut,int nVars,int *pStore)

{
  bool bVar1;
  int iVar2;
  int local_34;
  int nOnes;
  int fChange;
  int Temp;
  int i;
  int nWords;
  int *pStore_local;
  int nVars_local;
  word *pInOut_local;
  
  iVar2 = Kit_TruthWordNum_64bit(nVars);
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckySwap.c"
                  ,0x16a,"void Kit_TruthSemiCanonicize_Yasha_simple(word *, int, int *)");
  }
  local_34 = Kit_TruthCountOnes_64bit(pInOut,nVars);
  if (iVar2 * 0x20 < local_34) {
    Kit_TruthNot_64bit(pInOut,nVars);
    local_34 = iVar2 * 0x40 - local_34;
  }
  Kit_TruthCountOnesInCofs_64bit(pInOut,nVars,pStore);
  for (fChange = 0; fChange < nVars; fChange = fChange + 1) {
    if (pStore[fChange] < local_34 - pStore[fChange]) {
      pStore[fChange] = local_34 - pStore[fChange];
      Kit_TruthChangePhase_64bit(pInOut,nVars,fChange);
    }
  }
  do {
    bVar1 = false;
    for (fChange = 0; fChange < nVars + -1; fChange = fChange + 1) {
      if (pStore[fChange + 1] < pStore[fChange]) {
        bVar1 = true;
        iVar2 = pStore[fChange];
        pStore[fChange] = pStore[fChange + 1];
        pStore[fChange + 1] = iVar2;
        Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,fChange);
      }
    }
  } while (bVar1);
  return;
}

Assistant:

void  Kit_TruthSemiCanonicize_Yasha_simple( word* pInOut, int nVars, int * pStore )
{
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, Temp, fChange, nOnes; 
    assert( nVars <= 16 );
    
    nOnes = Kit_TruthCountOnes_64bit(pInOut, nVars);
    
    if ( (nOnes > nWords * 32) )
    { 
        Kit_TruthNot_64bit( pInOut, nVars );
        nOnes = nWords*64 - nOnes;
    }
    
    // collect the minterm counts
    Kit_TruthCountOnesInCofs_64bit( pInOut, nVars, pStore );
    
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[i] >= nOnes-pStore[i])
            continue;        
        pStore[i] = nOnes-pStore[i]; 
        Kit_TruthChangePhase_64bit( pInOut, nVars, i );
    }  
    
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[i] <= pStore[i+1] )
                continue;            
            fChange = 1;            
            
            Temp = pStore[i];
            pStore[i] = pStore[i+1];
            pStore[i+1] = Temp;
            
            Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, i );            
        }
    } while ( fChange ); 
}